

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIButton::drawSprite
          (CGUIButton *this,EGUI_BUTTON_STATE state,u32 startTime,position2di *center)

{
  undefined4 uVar1;
  long *plVar2;
  u32 uVar3;
  undefined8 in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  SColor colors [4];
  u32 stateIdx;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  uint local_1c;
  int local_10;
  
  if (*(int *)(in_RDI + 0x134 + (ulong)in_ESI * 0xc) != -1) {
    local_1c = in_ESI;
    if ((*(byte *)(in_RDI + (ulong)in_ESI * 0xc + 0x13d) & 1) == 0) {
      plVar2 = *(long **)(in_RDI + 0x188);
      uVar1 = *(undefined4 *)(in_RDI + 0x134 + (ulong)in_ESI * 0xc);
      uVar3 = os::Timer::getTime();
      (**(code **)(*plVar2 + 0x40))
                (plVar2,uVar1,in_RCX,in_RDI + 0x50,in_RDI + (ulong)in_ESI * 0xc + 0x138,in_EDX,uVar3
                 ,*(byte *)(in_RDI + (ulong)local_1c * 0xc + 0x13c) & 1,1);
    }
    else {
      local_38 = *(undefined4 *)(in_RDI + (ulong)in_ESI * 0xc + 0x138);
      local_34 = *(undefined4 *)(in_RDI + (ulong)in_ESI * 0xc + 0x138);
      local_30 = *(undefined4 *)(in_RDI + (ulong)in_ESI * 0xc + 0x138);
      local_2c = *(undefined4 *)(in_RDI + (ulong)in_ESI * 0xc + 0x138);
      plVar2 = *(long **)(in_RDI + 0x188);
      uVar1 = *(undefined4 *)(in_RDI + 0x134 + (ulong)in_ESI * 0xc);
      local_10 = in_EDX;
      uVar3 = os::Timer::getTime();
      (**(code **)(*plVar2 + 0x48))
                (plVar2,uVar1,in_RDI + 0x40,in_RDI + 0x50,&local_38,uVar3 - local_10,
                 *(byte *)(in_RDI + (ulong)local_1c * 0xc + 0x13c) & 1);
    }
  }
  return;
}

Assistant:

void CGUIButton::drawSprite(EGUI_BUTTON_STATE state, u32 startTime, const core::position2di &center)
{
	u32 stateIdx = (u32)state;

	if (ButtonSprites[stateIdx].Index != -1) {
		if (ButtonSprites[stateIdx].Scale) {
			const video::SColor colors[] = {ButtonSprites[stateIdx].Color, ButtonSprites[stateIdx].Color, ButtonSprites[stateIdx].Color, ButtonSprites[stateIdx].Color};
			SpriteBank->draw2DSprite(ButtonSprites[stateIdx].Index, AbsoluteRect,
					&AbsoluteClippingRect, colors,
					os::Timer::getTime() - startTime, ButtonSprites[stateIdx].Loop);
		} else {
			SpriteBank->draw2DSprite(ButtonSprites[stateIdx].Index, center,
					&AbsoluteClippingRect, ButtonSprites[stateIdx].Color, startTime, os::Timer::getTime(),
					ButtonSprites[stateIdx].Loop, true);
		}
	}
}